

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtesting.c
# Opt level: O3

int RDL_cmp_cycles(void *vc1,void *vc2)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  char cVar7;
  int iVar8;
  
  uVar3 = 0;
  uVar4 = 0;
  uVar5 = 0;
  iVar2 = 0;
  do {
    uVar6 = (ulong)uVar5;
    cVar1 = *(char *)(*vc1 + uVar6);
    if (cVar1 == '\0') {
      cVar7 = *(char *)(*vc2 + uVar6);
    }
    else {
      if (cVar1 == '\x02') {
        uVar5 = 0xffffffff;
        if ((uVar4 <= uVar3) && (uVar5 = 1, uVar3 == uVar4)) {
          uVar5 = 0xffffffff;
          if (iVar2 != 1) {
            uVar5 = (uint)(iVar2 != 0);
          }
        }
        return uVar5;
      }
      iVar8 = iVar2;
      if (iVar2 == 0) {
        iVar8 = 1;
      }
      uVar3 = uVar3 + 1;
      cVar7 = *(char *)(*vc2 + uVar6);
      if (cVar7 == '\0') {
        iVar2 = iVar8;
      }
    }
    if (cVar7 != '\0') {
      iVar8 = iVar2;
      if (iVar2 == 0) {
        iVar8 = 2;
      }
      uVar4 = uVar4 + 1;
      if (cVar1 == '\0') {
        iVar2 = iVar8;
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int RDL_cmp_cycles(const void* vc1, const void* vc2)
{
  unsigned first_difference = 0;
  unsigned len1 = 0;
  unsigned len2 = 0;
  unsigned i = 0;

  const char* c1 = *((const char**) vc1);
  const char* c2 = *((const char**) vc2);

  while (c1[i] != 2) {
    if (c1[i]) {
      ++len1;
      if (!c2[i] && !first_difference) {
        first_difference = 1;
      }
    }
    if (c2[i]) {
      ++len2;
      if (!c1[i] && !first_difference) {
        first_difference = 2;
      }
    }
    ++i;
  }

  if (len1 < len2) {
    return -1;
  }
  else if (len1 == len2) {
    if (first_difference == 1) {
      return -1;
    }
    else if (first_difference == 0) {
      return 0;
    }
  }

  return 1;
}